

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O0

void __thiscall choc::value::Value::Value(Value *this,Type *t,void *source,size_t size)

{
  void *t_00;
  uchar *d;
  allocator<unsigned_char> local_29;
  size_t local_28;
  size_t size_local;
  void *source_local;
  Type *t_local;
  Value *this_local;
  
  local_28 = size;
  size_local = (size_t)source;
  source_local = t;
  t_local = (Type *)this;
  std::allocator<unsigned_char>::allocator(&local_29);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,(uchar *)source,
             (uchar *)((long)source + size),&local_29);
  std::allocator<unsigned_char>::~allocator(&local_29);
  SimpleStringDictionary::SimpleStringDictionary(&this->dictionary);
  t_00 = source_local;
  d = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->packedData);
  ValueView::ValueView(&this->value,(Type *)t_00,d,&(this->dictionary).super_StringDictionary);
  return;
}

Assistant:

inline Value::Value (const Type& t, const void* source, size_t size)
   : packedData (static_cast<const uint8_t*> (source), static_cast<const uint8_t*> (source) + size),
     value (t, packedData.data(), std::addressof (dictionary))
{
}